

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O3

void localMaxima(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                int threshold)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  int m;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  Mat cThreshold;
  long local_218;
  undefined8 local_1f8;
  Mat local_1f0 [8];
  int local_1e8;
  int local_1e4;
  long local_1e0;
  long *local_1a8;
  undefined1 local_190 [16];
  float local_180;
  undefined8 local_17c;
  Mat local_120 [96];
  Mat local_c0 [144];
  
  local_1f8 = CONCAT44((int)**(undefined8 **)(cNorm + 0x40),
                       (int)((ulong)**(undefined8 **)(cNorm + 0x40) >> 0x20));
  cv::Mat::zeros(local_190,&local_1f8,5);
  cv::Mat::Mat(local_1f0);
  (**(code **)(*(long *)CONCAT44(local_190._4_4_,local_190._0_4_) + 0x18))
            ((long *)CONCAT44(local_190._4_4_,local_190._0_4_),local_190,local_1f0,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat((Mat *)&local_180);
  iVar1 = *(int *)(cNorm + 8);
  lVar14 = (long)iVar1;
  uVar2 = *(uint *)(cNorm + 0xc);
  if (0 < lVar14) {
    lVar10 = *(long *)(cNorm + 0x10);
    plVar3 = *(long **)(cNorm + 0x48);
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar13 = *plVar3;
        uVar12 = 0;
        do {
          fVar20 = *(float *)(lVar13 * lVar7 + lVar10 + uVar12 * 4);
          if ((float)threshold <= fVar20) {
            *(float *)(*local_1a8 * lVar7 + local_1e0 + uVar12 * 4) = fVar20;
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar14);
  }
  if (3 < local_1e8) {
    uVar12 = 1;
    local_218 = 0;
    do {
      if (3 < local_1e4) {
        lVar10 = *local_1a8;
        pfVar9 = (float *)(lVar10 * local_218 + local_1e0);
        uVar18 = 1;
        iVar17 = 0;
        do {
          fVar20 = 0.0;
          iVar6 = -1;
          lVar7 = -1;
          iVar5 = -1;
          pfVar11 = pfVar9;
          do {
            iVar19 = (int)uVar12 + (int)lVar7;
            lVar13 = 0;
            pfVar15 = pfVar11;
            fVar21 = fVar20;
            do {
              fVar20 = *pfVar15;
              pfVar8 = pfVar15;
              if (((fVar20 == 0.0) && (!NAN(fVar20))) || (fVar20 < fVar21)) {
LAB_00106648:
                *pfVar8 = 0.0;
                iVar4 = iVar5;
                iVar16 = iVar6;
                fVar20 = fVar21;
              }
              else {
                iVar16 = (int)lVar13 + iVar17;
                iVar4 = iVar19;
                if (iVar5 != -1) {
                  pfVar8 = (float *)(iVar5 * lVar10 + local_1e0 + (long)iVar6 * 4);
                  fVar21 = fVar20;
                  iVar5 = iVar19;
                  iVar6 = iVar16;
                  goto LAB_00106648;
                }
              }
              iVar6 = iVar16;
              iVar5 = iVar4;
              pfVar15 = pfVar15 + 1;
              lVar13 = lVar13 + 1;
              fVar21 = fVar20;
            } while (lVar13 != 3);
            lVar7 = lVar7 + 1;
            pfVar11 = (float *)((long)pfVar11 + lVar10);
          } while (lVar7 != 2);
          uVar18 = uVar18 + 1;
          pfVar9 = pfVar9 + 1;
          iVar17 = iVar17 + 1;
        } while (uVar18 != local_1e4 - 2);
      }
      uVar12 = uVar12 + 1;
      local_218 = local_218 + 1;
    } while (uVar12 != local_1e8 - 2);
  }
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar12 = 0;
        do {
          fVar20 = *(float *)(*local_1a8 * lVar10 + local_1e0 + uVar12 * 4);
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            local_190._0_4_ = (undefined4)(int)uVar12;
            local_190._8_4_ = 5.0;
            local_190._12_4_ = -1.0;
            local_17c._0_4_ = 0;
            local_17c._4_4_ = -1;
            local_190._4_4_ = (float)(int)lVar10;
            local_180 = fVar20;
            std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                      (corners,(value_type *)local_190);
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar14);
  }
  cv::Mat::~Mat(local_1f0);
  return;
}

Assistant:

void localMaxima(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	Mat cThreshold = Mat::zeros(cNorm.size(), CV_32F);

	int rows = cNorm.rows;
	int cols = cNorm.cols;
	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cNorm.at<float>(i, j);
			if (intensity >= threshold) {
				cThreshold.at<float>(i, j) = intensity;
			}
		}
	}

	for (int i = 1; i < cThreshold.rows - 2; ++i) {
		for (int j = 1; j < cThreshold.cols - 2; ++j) {
			//loop within 3*3 box
			float max = 0;
			int row=-1, col=-1;
			for (int m = -1; m < 2; ++m) {
				for (int n = -1; n < 2; ++n) {
					float current = cThreshold.at<float>(i+m, j+n);
					if (current!=0 && current >= max) {
						max = current;
						//set previous max to 0
						if (row != -1) cThreshold.at<float>(row, col) = 0.0F;
						row = i + m;
						col = j + n;
					}
					else {
						cThreshold.at<float>(i+m,j+n) = 0.0F;
					}
				}
			}

		}
	}

	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cThreshold.at<float>(i, j);
			if (intensity != 0) {
				KeyPoint kPoint(Point(j, i), 5, -1.0F, intensity);
				corners.push_back(kPoint);
			}
		}
	}

}